

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

int quicly_local_cid_retire(quicly_local_cid_set_t *set,uint64_t sequence,int *_has_pending)

{
  bool bVar1;
  quicly_cid_plaintext_t *pqVar2;
  int iVar3;
  int *in_RDX;
  quicly_local_cid_t *in_RSI;
  quicly_local_cid_set_t *in_RDI;
  size_t i_1;
  size_t i;
  int becomes_empty;
  size_t retired_at;
  quicly_local_cid_set_t *in_stack_ffffffffffffffb8;
  quicly_local_cid_set_t *local_38;
  quicly_local_cid_set_t *local_28;
  int local_4;
  
  local_28 = (quicly_local_cid_set_t *)in_RDI->_size;
  bVar1 = true;
  local_38 = (quicly_local_cid_set_t *)0x0;
  do {
    if ((quicly_local_cid_set_t *)in_RDI->_size <= local_38) {
      if (local_28 == (quicly_local_cid_set_t *)in_RDI->_size) {
        iVar3 = has_pending(in_RDI);
        *in_RDX = iVar3;
        local_4 = 0;
      }
      else if (bVar1) {
        local_4 = 0x2000a;
      }
      else {
        in_RDI->cids[(long)local_28].state = QUICLY_LOCAL_CID_STATE_IDLE;
        in_RDI->cids[(long)local_28].sequence = 0xffffffffffffffff;
        while ((pqVar2 = &local_28->plaintext,
               local_28 = (quicly_local_cid_set_t *)((long)&pqVar2->master_id + 1),
               local_28 < (quicly_local_cid_set_t *)in_RDI->_size &&
               (in_RDI->cids[(long)((long)&pqVar2->master_id + 1)].state ==
                QUICLY_LOCAL_CID_STATE_PENDING))) {
          swap_cids((quicly_local_cid_t *)in_RDI,in_RSI);
        }
        iVar3 = generate_cid(in_stack_ffffffffffffffb8,0x14fe34);
        if (iVar3 == 0) {
          iVar3 = has_pending(in_RDI);
          *in_RDX = iVar3;
        }
        else {
          do_mark_pending(local_28,(size_t)in_stack_ffffffffffffffb8);
          *in_RDX = 1;
        }
        local_4 = 0;
      }
      return local_4;
    }
    if (in_RDI->cids[(long)local_38].state != QUICLY_LOCAL_CID_STATE_IDLE) {
      if ((quicly_local_cid_t *)in_RDI->cids[(long)local_38].sequence == in_RSI) {
        if (local_28 != (quicly_local_cid_set_t *)in_RDI->_size) {
          __assert_fail("retired_at == set->_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                        ,0xbf,
                        "int quicly_local_cid_retire(quicly_local_cid_set_t *, uint64_t, int *)");
        }
        local_28 = local_38;
      }
      else {
        bVar1 = false;
      }
    }
    local_38 = (quicly_local_cid_set_t *)((long)&(local_38->plaintext).master_id + 1);
  } while( true );
}

Assistant:

int quicly_local_cid_retire(quicly_local_cid_set_t *set, uint64_t sequence, int *_has_pending)
{
    /* find the CID to be retired, also check if there is at least one CID that has been issued */
    size_t retired_at = set->_size;
    int becomes_empty = 1;
    for (size_t i = 0; i < set->_size; i++) {
        if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_IDLE)
            continue;
        if (set->cids[i].sequence == sequence) {
            assert(retired_at == set->_size);
            retired_at = i;
        } else {
            becomes_empty = 0;
        }
    }

    /* nothing to do if given CID has been retired already */
    if (retired_at == set->_size) {
        *_has_pending = has_pending(set);
        return 0;
    }

    /* it is a protocol violation for the remote peer to retire the only CID that is available to it */
    if (becomes_empty)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* retire given CID */
    set->cids[retired_at].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[retired_at].sequence = UINT64_MAX;

    /* move following PENDING CIDs to front */
    for (size_t i = retired_at + 1; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[retired_at]);
        retired_at = i;
    }

    /* generate one new CID */
    if (generate_cid(set, retired_at)) {
        do_mark_pending(set, retired_at);
        *_has_pending = 1;
    } else {
        *_has_pending = has_pending(set);
    }

    return 0;
}